

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

int asl::myltoa(Long x,char *s)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  char ss [32];
  
  bVar4 = x < 0;
  if (x == 0) {
    *s = '0';
    iVar1 = 1;
    uVar2 = 1;
  }
  else {
    if (bVar4) {
      *s = '-';
      x = -x;
    }
    uVar2 = (ulong)bVar4;
    uVar3 = 0xffffffffffffffff;
    do {
      ss[uVar3 + 1] = (char)x + (char)((ulong)x / 10) * -10 | 0x30;
      uVar3 = uVar3 + 1;
      bVar4 = 9 < (ulong)x;
      x = (ulong)x / 10;
    } while (bVar4);
    do {
      s[uVar2] = ss[uVar3 & 0xffffffff];
      uVar2 = uVar2 + 1;
      uVar3 = uVar3 - 1;
    } while (1 < (int)uVar3 + 2);
    iVar1 = (int)uVar2;
  }
  s[uVar2] = '\0';
  return iVar1;
}

Assistant:

int myltoa(Long x, char* s)
{
	char ss[32];
	int i = 0, j = 0;
	if (x == 0)
	{
		s[0] = '0';
		s[1] = '\0';
		return 1;
	}
	if (x<0)
	{
		s[j++] = '-';
		x = -x;
	}
	while (x != 0) {
		ss[i++] = char(x % 10) + '0';
		x = x / 10;
	}
	while (i > 0)
		s[j++] = ss[--i];
	s[j] = '\0';
	return j;
}